

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void print_fasta_seq(kseq_t *seq,int n)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  char *__ptr;
  ulong uVar7;
  undefined8 uVar8;
  char *in_RCX;
  long extraout_RDX;
  undefined4 in_register_00000034;
  char *pcVar9;
  FILE *__stream;
  size_t __size;
  ulong in_R8;
  ulong uVar10;
  
  pcVar9 = (char *)CONCAT44(in_register_00000034,n);
  sVar1 = (seq->seq).l;
  __stream = (FILE *)(long)(n + 1);
  pcVar5 = (char *)malloc((size_t)__stream);
  if (pcVar5 == (char *)0x0) {
    print_fasta_seq_cold_1();
    pcVar5 = pcVar9;
    sVar6 = strlen(in_RCX);
    __size = in_R8 + 1;
    __ptr = (char *)malloc(__size);
    if (__ptr != (char *)0x0) {
      uVar4 = (uint)sVar6;
      if (in_R8 < (ulong)(long)(int)uVar4) {
        if (extraout_RDX == 0) {
          fprintf(__stream,">%s\n",pcVar9);
        }
        else {
          fprintf(__stream,">%s %s\n",pcVar9,extraout_RDX);
        }
        uVar10 = 0;
        if (0 < (int)uVar4) {
          uVar10 = 0;
          iVar3 = 0;
          do {
            uVar7 = (ulong)iVar3;
            if (uVar7 < in_R8) {
              __ptr[uVar7] = in_RCX[uVar10];
              iVar3 = iVar3 + 1;
            }
            else {
              __ptr[uVar7] = '\0';
              fprintf(__stream,"%s\n",__ptr);
              *__ptr = '\0';
              *__ptr = in_RCX[uVar10];
              iVar3 = 1;
            }
            uVar10 = uVar10 + 1;
          } while ((uVar4 & 0x7fffffff) != uVar10);
          uVar10 = (ulong)iVar3;
        }
        if (uVar10 < in_R8) {
          __ptr[uVar10] = '\0';
        }
        if (*__ptr != '\0') {
          fprintf(__stream,"%s\n",__ptr);
        }
      }
      else if (extraout_RDX == 0) {
        fprintf(__stream,">%s\n%s\n",pcVar9,in_RCX);
      }
      else {
        fprintf(__stream,">%s %s\n%s\n",pcVar9,extraout_RDX,in_RCX);
      }
      free(__ptr);
      return;
    }
    print_fasta_cold_1();
    if (pcVar5 == (char *)0x0) {
      return;
    }
    uVar8 = pcre2_match_data_create_from_pattern_8();
    sVar6 = strlen(pcVar5);
    uVar4 = pcre2_match_8(__size,pcVar5,sVar6,0,0,uVar8,0);
    pcre2_match_data_free_8(uVar8);
    if (((int)uVar4 < 0) && (uVar4 != 0xffffffff)) {
      fprintf(_stderr,"Problem with your regex (%d)\n",(ulong)uVar4);
    }
    return;
  }
  iVar3 = 0x32;
  if (0 < n) {
    iVar3 = n;
  }
  uVar4 = (uint)sVar1;
  if ((int)uVar4 <= iVar3) {
    pcVar9 = (seq->name).s;
    if ((seq->comment).l == 0) {
      printf(">%s\n%s\n",pcVar9,(seq->seq).s);
    }
    else {
      printf(">%s %s\n%s\n",pcVar9,(seq->comment).s,(seq->seq).s);
    }
    goto LAB_00103c5b;
  }
  if ((seq->comment).s == (char *)0x0) {
    pcVar9 = (seq->name).s;
LAB_00103bcf:
    printf(">%s\n",pcVar9);
  }
  else {
    pcVar9 = (seq->name).s;
    if ((seq->comment).l == 0) goto LAB_00103bcf;
    printf(">%s %s\n",pcVar9);
  }
  if ((int)uVar4 < 1) {
    iVar2 = 0;
  }
  else {
    uVar10 = 0;
    iVar2 = 0;
    do {
      if (iVar2 < iVar3) {
        pcVar5[iVar2] = (seq->seq).s[uVar10];
        iVar2 = iVar2 + 1;
      }
      else {
        pcVar5[iVar2] = '\0';
        puts(pcVar5);
        *pcVar5 = '\0';
        *pcVar5 = (seq->seq).s[uVar10];
        iVar2 = 1;
      }
      uVar10 = uVar10 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar10);
  }
  if (iVar2 < iVar3) {
    pcVar5[iVar2] = '\0';
  }
  if (*pcVar5 != '\0') {
    puts(pcVar5);
  }
LAB_00103c5b:
  free(pcVar5);
  return;
}

Assistant:

void print_fasta_seq(kseq_t *seq, int n)
{
	int l = seq->seq.l;   /* sequence length */
	int x,i=0;
	char *seqbuf = NULL;
	seqbuf = (char *)malloc(sizeof(char) * (n + 1));
	if (seqbuf == NULL) {
		fprintf(stderr,"print_seq: out of memory for seqbuf!\n");
		exit(EXIT_FAILURE);
	}

	if (n <= 0)
		n = 50;

	if (l > n) {                  /* seqlength is > column length - split sequence */
		if (seq->comment.s == NULL) {
			printf(">%s\n",seq->name.s);
		} else {
			if (seq->comment.l == 0)
				printf(">%s\n",seq->name.s);
			else
				printf(">%s %s\n",seq->name.s, seq->comment.s);
		}

		for (x=0; x<l;x++) {
			if (i < n) {                     /* there's less sequence than the column width */
				seqbuf[i] = seq->seq.s[x];
				i++;
			} else {                         /* i is >= column width, so print this line */
				seqbuf[i] = '\0';            /* set last position in string to null */
				printf("%s\n",seqbuf);       /* print this line */
				i = 0;                       /* reset i */
				seqbuf[0] = '\0';            /* reset buffer */
				seqbuf[i] = seq->seq.s[x];   /* set this buffer line to current sequence char */
				i++;
			}
		}
		if (i<n)
			seqbuf[i] = '\0';
		if (strlen(seqbuf) > 0)
			printf("%s\n",seqbuf);
	} else {                     /* seqlength < column length, so just print the full sequence */
		if (seq->comment.l == 0)
			printf(">%s\n%s\n",seq->name.s,seq->seq.s);
		else
			printf(">%s %s\n%s\n",seq->name.s,seq->comment.s,seq->seq.s);
	}
	free(seqbuf);
}